

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  pointer ppEVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  RandSeqProductionSymbol *pRVar5;
  undefined8 uVar6;
  byte *pbVar7;
  byte *pbVar8;
  pointer pCVar9;
  byte *pbVar10;
  pointer pCVar11;
  byte *pbVar12;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar7 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar10 = pbVar7 + sVar1 * 0x30;
  if (*(byte **)(dst + 8) < pbVar10) {
    pbVar8 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x30,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_00346cc2;
    pCVar9 = this->data_;
    pCVar11 = pCVar9 + sVar1;
    pbVar10 = pbVar8 + sVar1 * 0x30;
    pbVar7 = pbVar8;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar10;
    pCVar9 = this->data_;
    pCVar11 = pCVar9 + sVar1;
    pbVar8 = pbVar7;
  }
  do {
    pbVar12 = pbVar7 + 0x30;
    ppEVar2 = (pCVar9->expressions)._M_ptr;
    uVar3 = (pCVar9->expressions)._M_extent._M_extent_value;
    uVar4 = *(undefined8 *)&pCVar9->item;
    pRVar5 = (pCVar9->item).target;
    uVar6 = (pCVar9->item).args._M_extent._M_extent_value;
    *(pointer *)(pbVar7 + 0x20) = (pCVar9->item).args._M_ptr;
    *(undefined8 *)(pbVar7 + 0x28) = uVar6;
    *(undefined8 *)(pbVar7 + 0x10) = uVar4;
    *(RandSeqProductionSymbol **)(pbVar7 + 0x18) = pRVar5;
    *(pointer *)pbVar7 = ppEVar2;
    *(undefined8 *)(pbVar7 + 8) = uVar3;
    if (pCVar9 + 1 == pCVar11) break;
    pCVar9 = pCVar9 + 1;
    pbVar7 = pbVar12;
  } while (pbVar12 != pbVar10);
LAB_00346cc2:
  return (int)pbVar8;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }